

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_loading_thread.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ALLEGRO_BITMAP *bitmap;
  undefined8 uVar5;
  long lVar6;
  ALLEGRO_BITMAP *bitmap_00;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong extraout_RDX;
  ALLEGRO_BITMAP **ppAVar13;
  int iVar14;
  char *format;
  int iVar15;
  ulong uVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ALLEGRO_EVENT event;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_image_addon();
    al_init_font_addon();
    al_init_primitives_addon();
    al_install_mouse();
    al_install_keyboard();
    bitmap = (ALLEGRO_BITMAP *)al_load_bitmap("data/cursor.tga");
    iVar17 = 0;
    log_printf("default bitmap without display: %p\n",bitmap);
    al_set_new_bitmap_flags(0x400);
    uVar5 = al_load_bitmap("data/cursor.tga");
    log_printf("video bitmap without display: %p\n",uVar5);
    log_printf("%p before create_display: ",bitmap);
    print_bitmap_flags(bitmap);
    log_printf("\n");
    lVar6 = al_create_display(0x40,0x40);
    if (lVar6 != 0) {
      bitmap_00 = (ALLEGRO_BITMAP *)al_load_bitmap("data/cursor.tga");
      log_printf("video bitmap with display: %p\n",bitmap_00);
      log_printf("%p after create_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after create_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      al_destroy_display(lVar6);
      log_printf("%p after destroy_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after destroy_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      uVar5 = al_create_display(0x280,0x1e0);
      log_printf("%p after create_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after create_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      uVar7 = al_load_font("data/fixed_font.tga",0,0);
      mutex = (ALLEGRO_MUTEX *)al_create_mutex();
      uVar8 = al_create_thread(loading_thread,0);
      al_start_thread(uVar8);
      uVar9 = al_create_timer(0x11111111);
      uVar10 = al_create_event_queue();
      uVar11 = al_get_keyboard_event_source();
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_display_event_source(uVar5);
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_timer_event_source(uVar9);
      al_register_event_source(uVar10,uVar11);
      al_start_timer(uVar9);
      bVar1 = 1;
      iVar15 = 0;
LAB_0010283c:
      al_wait_for_event(uVar10,&event);
      if ((event.type == 0x2a) || ((event.type == 10 && (event.display.width == 0x3b)))) {
        al_join_thread(uVar8,0);
        al_destroy_mutex(mutex);
        al_destroy_font(uVar7);
        al_destroy_display(uVar5);
        return 0;
      }
      if (!(bool)(event.type != 0x1e & (bVar1 ^ 1))) goto code_r0x0010287c;
      goto LAB_00102a65;
    }
    format = "Error creating display\n";
  }
  abort_example(format);
  uVar5 = al_ustr_new("");
  uVar4 = al_get_bitmap_flags(format);
  if ((uVar4 >> 10 & 1) != 0) {
    al_ustr_append_cstr(uVar5," VIDEO");
  }
  uVar12 = al_get_bitmap_flags(format);
  if ((uVar12 & 1) != 0) {
    al_ustr_append_cstr(uVar5," MEMORY");
  }
  uVar4 = al_get_bitmap_flags(format);
  if ((uVar4 >> 0xc & 1) != 0) {
    al_ustr_append_cstr(uVar5," CONVERT");
  }
  al_ustr_trim_ws(uVar5);
  al_ustr_find_replace_cstr(uVar5,0," "," | ");
  uVar7 = al_cstr(uVar5);
  log_printf("%s",uVar7);
  iVar17 = al_ustr_free(uVar5);
  return iVar17;
code_r0x0010287c:
  cVar2 = al_is_event_queue_empty(uVar10);
  bVar1 = 1;
  if (cVar2 != '\0') {
    uVar19 = 0;
    uVar18 = al_map_rgb_f(0,0,0);
    al_get_time();
    al_map_rgb_f(0x3f000000,0x3f19999a,0x3f800000);
    al_clear_to_color();
    al_draw_textf(uVar18,uVar19,0x42700000,0x43a00000,uVar7,0,"Loading %d%%",load_count);
    al_lock_mutex(mutex);
    if (iVar17 < load_count) {
      al_convert_bitmap(bitmaps[iVar17]);
      iVar17 = iVar17 + 1;
    }
    al_unlock_mutex(mutex);
    uVar12 = extraout_RDX;
    if (iVar15 < iVar17) {
      ppAVar13 = bitmaps;
      iVar14 = 0;
      al_draw_bitmap(0,bitmaps[iVar15],0);
      if (iVar15 + 1 < iVar17) {
        iVar15 = iVar15 + 1;
      }
      uVar16 = 0;
      while( true ) {
        uVar12 = (uVar16 & 0xffffffff) % 0x14;
        if ((long)iVar15 < (long)uVar16) break;
        iVar3 = al_get_bitmap_width(*ppAVar13);
        al_draw_scaled_rotated_bitmap
                  (0,0,(float)(iVar14 + (int)((uVar16 & 0xffffffff) / 0x14) * -0x280),
                   (float)((int)((uVar16 & 0xffffffff) / 0x14) * 0x18 + 0x168),32.0 / (float)iVar3,
                   32.0 / (float)iVar3,0,*ppAVar13,0,(uVar16 & 0xffffffff) % 0x14);
        uVar16 = uVar16 + 1;
        iVar14 = iVar14 + 0x20;
        ppAVar13 = ppAVar13 + 1;
      }
    }
    if (iVar17 < 100) {
      al_draw_scaled_rotated_bitmap(bitmap,0,uVar12);
    }
    al_flip_display();
LAB_00102a65:
    bVar1 = 0;
  }
  goto LAB_0010283c;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   bool redraw = true;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *spin, *spin2;
   int current_bitmap = 0;
   int loaded_bitmap = 0;
   ALLEGRO_THREAD *thread;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();

   open_log();

   al_install_mouse();
   al_install_keyboard();

   spin = al_load_bitmap("data/cursor.tga");
   log_printf("default bitmap without display: %p\n", spin);

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap without display: %p\n", spin2);
   
   log_printf("%p before create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");

   display = al_create_display(64, 64);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap with display: %p\n", spin2);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   al_destroy_display(display);
   
   log_printf("%p after destroy_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after destroy_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   display = al_create_display(640, 480);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   font = al_load_font("data/fixed_font.tga", 0, 0);

   mutex = al_create_mutex();
   thread = al_create_thread(loading_thread, NULL);
   al_start_thread(thread);

   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);

      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
             break;
         }
      if (event.type == ALLEGRO_EVENT_TIMER)
         redraw = true;

      if (redraw && al_is_event_queue_empty(queue)) {
         float x = 20, y = 320;
         int i;
         ALLEGRO_COLOR color = al_map_rgb_f(0, 0, 0);
         float t = al_current_time();

         redraw = false;
         al_clear_to_color(al_map_rgb_f(0.5, 0.6, 1));
         
         al_draw_textf(font, color, x + 40, y, 0, "Loading %d%%",
            100 * load_count / load_total);

         al_lock_mutex(mutex);
         if (loaded_bitmap < load_count) {
            /* This will convert any video bitmaps without a display
             * (all the bitmaps being loaded in the loading_thread) to
             * video bitmaps we can use in the main thread.
             */
            al_convert_bitmap(bitmaps[loaded_bitmap]);
            loaded_bitmap++;
         }
         al_unlock_mutex(mutex);

         if (current_bitmap < loaded_bitmap) {
            int bw;
            al_draw_bitmap(bitmaps[current_bitmap], 0, 0, 0);
            if (current_bitmap + 1 < loaded_bitmap)
               current_bitmap++;

            for (i = 0; i <= current_bitmap; i++) {
               bw = al_get_bitmap_width(bitmaps[i]);
               al_draw_scaled_rotated_bitmap(bitmaps[i],
                  0, 0, (i % 20) * 640 / 20, 360 + (i / 20) * 24,
                  32.0 / bw, 32.0 / bw, 0, 0);
            }
         }
         
         if (loaded_bitmap < load_total) {
            al_draw_scaled_rotated_bitmap(spin,
               16, 16, x, y, 1.0, 1.0, t * ALLEGRO_PI * 2, 0);
         }
         
         al_flip_display();
      }
   }

   al_join_thread(thread, NULL);
   al_destroy_mutex(mutex);
   al_destroy_font(font); 
   al_destroy_display(display);

   close_log(true);

   return 0;
}